

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_ack_frequency_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_ack_frequency_frame_t frame;
  quicly_ack_frequency_frame_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint8_t **in_stack_ffffffffffffffc8;
  ulong local_30;
  long local_28;
  uint8_t local_20;
  int local_4;
  
  iVar1 = recognize_delayed_ack(in_RDI);
  if (iVar1 == 0) {
    local_4 = 0x20007;
  }
  else {
    local_4 = quicly_decode_ack_frequency_frame
                        (in_stack_ffffffffffffffc8,
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    if (local_4 == 0) {
      if (local_28 == 25000) {
        if ((uint8_t **)(in_RDI->ingress).ack_frequency.next_sequence <= in_stack_ffffffffffffffc8)
        {
          (in_RDI->ingress).ack_frequency.next_sequence = (long)in_stack_ffffffffffffffc8 + 1;
          if (99 < local_30) {
            local_30 = 100;
          }
          (in_RDI->application->super).packet_tolerance = (uint32_t)local_30;
          (in_RDI->application->super).ignore_order = local_20;
        }
        local_4 = 0;
      }
      else {
        local_4 = 0x2000a;
      }
    }
  }
  return local_4;
}

Assistant:

static int handle_ack_frequency_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frequency_frame_t frame;
    int ret;

    /* recognize the frame only when the support has been advertised */
    if (!recognize_delayed_ack(conn))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((ret = quicly_decode_ack_frequency_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(ACK_FREQUENCY_RECEIVE, conn, conn->stash.now, frame.sequence, frame.packet_tolerance, frame.max_ack_delay,
                 frame.ignore_order);

    /* At the moment, the only value that the remote peer would send is this value, because our TP.min_ack_delay and max_ack_delay
     * are equal. */
    if (frame.max_ack_delay != QUICLY_LOCAL_MAX_ACK_DELAY * 1000)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    if (frame.sequence >= conn->ingress.ack_frequency.next_sequence) {
        conn->ingress.ack_frequency.next_sequence = frame.sequence + 1;
        conn->application->super.packet_tolerance =
            (uint32_t)(frame.packet_tolerance < QUICLY_MAX_PACKET_TOLERANCE ? frame.packet_tolerance : QUICLY_MAX_PACKET_TOLERANCE);
        conn->application->super.ignore_order = frame.ignore_order;
    }

    return 0;
}